

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

void rw::d3d8::defaultUninstanceCB(Geometry *geo,InstanceData *inst)

{
  uint8 *src_00;
  int local_24;
  uint8 *puStack_20;
  int32 i;
  uint8 *src;
  InstanceData *inst_local;
  Geometry *geo_local;
  
  src_00 = d3d::lockVertices(inst->vertexBuffer,0,0,0);
  uninstV3d(8,geo->morphTargets->vertices + inst->minVert,src_00,inst->numVertices,inst->stride);
  puStack_20 = src_00 + 0xc;
  if ((geo->flags & 0x10) != 0) {
    uninstV3d(8,geo->morphTargets->normals + inst->minVert,puStack_20,inst->numVertices,inst->stride
             );
    puStack_20 = src_00 + 0x18;
  }
  inst->vertexAlpha = '\0';
  if ((geo->flags & 8) != 0) {
    uninstColor(10,geo->colors + inst->minVert,puStack_20,inst->numVertices,inst->stride);
    puStack_20 = puStack_20 + 4;
  }
  for (local_24 = 0; local_24 < geo->numTexCoordSets; local_24 = local_24 + 1) {
    uninstTexCoords(7,geo->texCoords[local_24] + inst->minVert,puStack_20,inst->numVertices,
                    inst->stride);
    puStack_20 = puStack_20 + 8;
  }
  d3d::unlockVertices(inst->vertexBuffer);
  return;
}

Assistant:

void
defaultUninstanceCB(Geometry *geo, InstanceData *inst)
{
	uint8 *src = lockVertices(inst->vertexBuffer, 0, 0, D3DLOCK_NOSYSLOCK);
	uninstV3d(VERT_FLOAT3,
		&geo->morphTargets[0].vertices[inst->minVert],
		src, inst->numVertices, inst->stride);
	src += 12;

	if(geo->flags & Geometry::NORMALS){
		uninstV3d(VERT_FLOAT3,
		          &geo->morphTargets[0].normals[inst->minVert],
		          src, inst->numVertices, inst->stride);
		src += 12;
	}

	inst->vertexAlpha = 0;
	if(geo->flags & Geometry::PRELIT){
		uninstColor(VERT_ARGB, &geo->colors[inst->minVert], src,
		            inst->numVertices, inst->stride);
		src += 4;
	}

	for(int32 i = 0; i < geo->numTexCoordSets; i++){
		uninstTexCoords(VERT_FLOAT2, &geo->texCoords[i][inst->minVert], src,
		          inst->numVertices, inst->stride);
		src += 8;
	}
	unlockVertices(inst->vertexBuffer);
}